

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O0

void __thiscall
gl4cts::RobustnessRobustBufferAccessBehavior::Buffer::BindBase(Buffer *this,GLuint index)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  GLuint index_local;
  Buffer *this_local;
  
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  BindBase((Functions *)CONCAT44(extraout_var,iVar1),this->m_id,this->m_target,index);
  return;
}

Assistant:

void Buffer::BindBase(glw::GLuint index) const
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	BindBase(gl, m_id, m_target, index);
}